

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  int *piVar1;
  byte bVar2;
  ushort uVar3;
  uint *puVar4;
  uint *puVar5;
  void *__ptr;
  int *__s;
  ulong uVar6;
  uchar *puVar7;
  unsigned_short *puVar8;
  uchar uVar9;
  byte bVar10;
  uint i;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint result;
  uint reverse2;
  uint uVar17;
  size_t sVar18;
  uint uVar19;
  size_t sVar20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  
  uVar6 = (ulong)tree->numcodes;
  puVar5 = (uint *)malloc(uVar6 * 4);
  tree->codes = puVar5;
  uVar16 = tree->maxbitlen;
  uVar19 = uVar16 + 1;
  sVar20 = (ulong)uVar19 * 4;
  __ptr = malloc(sVar20);
  __s = (int *)malloc(sVar20);
  bVar22 = puVar5 == (uint *)0x0;
  bVar23 = __ptr == (void *)0x0;
  bVar24 = __s == (int *)0x0;
  uVar17 = 0x53;
  if (!bVar24 && (!bVar23 && !bVar22)) {
    uVar17 = 0;
  }
  if (bVar24 || (bVar23 || bVar22)) {
    free(__ptr);
  }
  else {
    if (uVar19 != 0) {
      sVar20 = (ulong)uVar19 << 2;
      memset(__s,0,sVar20);
      memset(__ptr,0,sVar20);
    }
    if (uVar6 != 0) {
      puVar4 = tree->lengths;
      uVar12 = 0;
      do {
        piVar1 = (int *)((long)__ptr + (ulong)puVar4[uVar12] * 4);
        *piVar1 = *piVar1 + 1;
        uVar12 = uVar12 + 1;
      } while (uVar6 != uVar12);
    }
    if (uVar16 != 0) {
      uVar6 = 2;
      if (2 < uVar19) {
        uVar6 = (ulong)uVar19;
      }
      iVar11 = *__s;
      lVar14 = 0;
      do {
        iVar11 = (iVar11 + *(int *)((long)__ptr + lVar14 * 4)) * 2;
        __s[lVar14 + 1] = iVar11;
        lVar14 = lVar14 + 1;
      } while (uVar6 - 1 != lVar14);
    }
    uVar6 = (ulong)tree->numcodes;
    if (uVar6 != 0) {
      puVar4 = tree->lengths;
      uVar12 = 0;
      do {
        uVar13 = (ulong)puVar4[uVar12];
        if (uVar13 != 0) {
          uVar16 = __s[uVar13];
          __s[uVar13] = uVar16 + 1;
          puVar5[uVar12] = uVar16;
          puVar5[uVar12] = ~(-1 << ((byte)puVar4[uVar12] & 0x1f)) & uVar16;
        }
        uVar12 = uVar12 + 1;
      } while (uVar6 != uVar12);
    }
    free(__ptr);
    free(__s);
    if (bVar24 || (bVar23 || bVar22)) {
      return uVar17;
    }
    __s = (int *)malloc(0x800);
    if (__s == (int *)0x0) {
      return 0x53;
    }
    memset(__s,0,0x800);
    if (uVar6 != 0) {
      puVar4 = tree->lengths;
      uVar12 = 0;
      do {
        uVar16 = puVar4[uVar12];
        if (9 < uVar16) {
          uVar13 = 0;
          uVar17 = 8;
          iVar11 = 0;
          do {
            uVar13 = (ulong)((uint)uVar13 |
                            (uint)(((puVar5[uVar12] >> ((char)uVar16 - 9U & 0x1f)) >>
                                    (uVar17 & 0x1f) & 1) != 0) << ((byte)iVar11 & 0x1f));
            iVar11 = iVar11 + 1;
            uVar17 = uVar17 - 1;
          } while (iVar11 != 9);
          if (uVar16 < (uint)__s[uVar13]) {
            uVar16 = __s[uVar13];
          }
          __s[uVar13] = uVar16;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar6);
    }
    lVar14 = 0;
    sVar20 = 0x200;
    do {
      sVar18 = sVar20;
      lVar21 = 1L << ((char)__s[lVar14] - 9U & 0x3f);
      if ((uint)__s[lVar14] < 10) {
        lVar21 = 0;
      }
      sVar20 = sVar18 + lVar21;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x200);
    puVar7 = (uchar *)malloc(sVar20);
    tree->table_len = puVar7;
    puVar8 = (unsigned_short *)malloc(sVar20 * 2);
    tree->table_value = puVar8;
    uVar17 = 0x53;
    if (puVar8 != (unsigned_short *)0x0 && puVar7 != (uchar *)0x0) {
      if (sVar20 != 0) {
        lVar14 = 0;
        do {
          tree->table_len[lVar14] = '\x10';
          lVar14 = lVar14 + 1;
        } while (sVar18 + lVar21 != lVar14);
      }
      lVar14 = 0x200;
      lVar15 = 0;
      do {
        if (9 < (uint)__s[lVar15]) {
          uVar9 = (uchar)__s[lVar15];
          tree->table_len[lVar15] = uVar9;
          tree->table_value[lVar15] = (unsigned_short)lVar14;
          lVar14 = lVar14 + (1L << (uVar9 - 9 & 0x3f));
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x200);
      free(__s);
      if (tree->numcodes != 0) {
        uVar6 = 0;
        uVar12 = 0;
        do {
          uVar16 = tree->lengths[uVar6];
          if (uVar16 == 0) {
            bVar22 = false;
          }
          else {
            uVar19 = 0;
            bVar10 = 0;
            uVar17 = uVar16;
            do {
              uVar17 = uVar17 - 1;
              uVar19 = uVar19 | (uint)((tree->codes[uVar6] >> (uVar17 & 0x1f) & 1) != 0) <<
                                (bVar10 & 0x1f);
              bVar10 = bVar10 + 1;
            } while (uVar17 != 0);
            uVar12 = uVar12 + 1;
            bVar10 = (byte)uVar16;
            if (uVar16 < 10) {
              bVar22 = true;
              uVar16 = 1;
              do {
                uVar17 = uVar16 - 1 << (bVar10 & 0x1f) | uVar19;
                if (tree->table_len[uVar17] != '\x10') goto LAB_00121e5a;
                tree->table_len[uVar17] = bVar10;
                tree->table_value[uVar17] = (unsigned_short)uVar6;
                uVar17 = uVar16 >> (9 - bVar10 & 0x1f);
                uVar16 = uVar16 + 1;
              } while (uVar17 == 0);
            }
            else {
              bVar2 = tree->table_len[uVar19 & 0x1ff];
              bVar22 = true;
              if (bVar2 < uVar16) goto LAB_00121e5a;
              uVar3 = tree->table_value[uVar19 & 0x1ff];
              uVar16 = 1;
              do {
                uVar17 = (uVar16 - 1 << (bVar10 - 9 & 0x1f) | uVar19 >> 9) + (uint)uVar3;
                tree->table_len[uVar17] = bVar10;
                tree->table_value[uVar17] = (unsigned_short)uVar6;
                uVar17 = uVar16 >> (bVar2 - bVar10 & 0x1f);
                uVar16 = uVar16 + 1;
              } while (uVar17 == 0);
            }
            bVar22 = false;
          }
LAB_00121e5a:
          if (bVar22) {
            return 0x37;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < tree->numcodes);
        if (1 < uVar12) {
          if (sVar20 == 0) {
            return 0;
          }
          lVar14 = 0;
          do {
            if (tree->table_len[lVar14] == '\x10') {
              return 0x37;
            }
            lVar14 = lVar14 + 1;
          } while (lVar21 + sVar18 != lVar14);
          return 0;
        }
      }
      if (sVar20 == 0) {
        return 0;
      }
      uVar6 = 0;
      do {
        if (tree->table_len[uVar6] == '\x10') {
          tree->table_len[uVar6] = (0x1ff < uVar6) * '\t' + '\x01';
          tree->table_value[uVar6] = 0xffff;
        }
        uVar6 = uVar6 + 1;
      } while (lVar21 + sVar18 != uVar6);
      return 0;
    }
  }
  free(__s);
  return uVar17;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree) {
  unsigned* blcount;
  unsigned* nextcode;
  unsigned error = 0;
  unsigned bits, n;

  tree->codes = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  blcount = (unsigned*)lodepng_malloc((tree->maxbitlen + 1) * sizeof(unsigned));
  nextcode = (unsigned*)lodepng_malloc((tree->maxbitlen + 1) * sizeof(unsigned));
  if(!tree->codes || !blcount || !nextcode) error = 83; /*alloc fail*/

  if(!error) {
    for(n = 0; n != tree->maxbitlen + 1; n++) blcount[n] = nextcode[n] = 0;
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits != tree->numcodes; ++bits) ++blcount[tree->lengths[bits]];
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; ++bits) {
      nextcode[bits] = (nextcode[bits - 1] + blcount[bits - 1]) << 1u;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n != tree->numcodes; ++n) {
      if(tree->lengths[n] != 0) {
        tree->codes[n] = nextcode[tree->lengths[n]]++;
        /*remove superfluous bits from the code*/
        tree->codes[n] &= ((1u << tree->lengths[n]) - 1u);
      }
    }
  }

  lodepng_free(blcount);
  lodepng_free(nextcode);

  if(!error) error = HuffmanTree_makeTable(tree);
  return error;
}